

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  char cVar3;
  uchar uVar4;
  undefined1 uVar5;
  short sVar6;
  ushort uVar7;
  undefined8 uVar8;
  long lVar9;
  short sVar10;
  bool bVar11;
  byte bVar12;
  byte bVar13;
  stbi_uc sVar14;
  stbi_uc sVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  int iVar19;
  stbi__uint32 sVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  stbi__uint32 sVar24;
  stbi__uint32 sVar25;
  int iVar26;
  int iVar27;
  stbi__jpeg *psVar28;
  long lVar29;
  stbi__context *psVar30;
  uchar *puVar31;
  stbi_uc *psVar32;
  void *pvVar33;
  code *pcVar34;
  stbi__context *psVar35;
  undefined8 *puVar36;
  stbi_uc *psVar37;
  stbi__uint16 *data_00;
  ulong uVar38;
  undefined8 *puVar39;
  undefined1 *puVar40;
  short sVar41;
  short *psVar42;
  int id;
  uint uVar43;
  ulong uVar44;
  stbi_uc *psVar45;
  int iVar46;
  int iVar47;
  long lVar48;
  ulong uVar49;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar50;
  stbi__result_info *ri_00;
  stbi__jpeg *psVar51;
  int iVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  byte *pbVar56;
  uint uVar57;
  stbi_uc **ppsVar58;
  uint uVar59;
  ulong uVar60;
  stbi__uint16 *psVar61;
  bool bVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar65 [16];
  stbi__uint16 *local_8978;
  stbi_uc *local_8958;
  uint local_8948;
  uint local_88ec;
  stbi_uc *coutput [4];
  int local_88b8;
  int local_88b4;
  int local_88b0;
  short data [64];
  
  psVar37 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar28 = (stbi__jpeg *)malloc(0x4888);
  psVar28->s = s;
  psVar28->idct_block_kernel = stbi__idct_simd;
  psVar28->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar28->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar19 = stbi__decode_jpeg_header(psVar28,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar28);
  if (iVar19 != 0) {
    psVar28 = (stbi__jpeg *)malloc(0x4888);
    psVar28->s = s;
    psVar28->idct_block_kernel = stbi__idct_simd;
    psVar28->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar28->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar29 = 0x46d8; lVar29 != 0x4858; lVar29 = lVar29 + 0x60) {
        psVar37 = psVar28->huff_dc[0].fast + lVar29 + -8;
        psVar37[0] = '\0';
        psVar37[1] = '\0';
        psVar37[2] = '\0';
        psVar37[3] = '\0';
        psVar37[4] = '\0';
        psVar37[5] = '\0';
        psVar37[6] = '\0';
        psVar37[7] = '\0';
        psVar37[8] = '\0';
        psVar37[9] = '\0';
        psVar37[10] = '\0';
        psVar37[0xb] = '\0';
        psVar37[0xc] = '\0';
        psVar37[0xd] = '\0';
        psVar37[0xe] = '\0';
        psVar37[0xf] = '\0';
      }
      psVar28->restart_interval = 0;
      iVar19 = stbi__decode_jpeg_header(psVar28,0);
      if (iVar19 != 0) {
        paVar1 = psVar28->img_comp;
        bVar12 = stbi__get_marker(psVar28);
LAB_001ae21c:
        if (bVar12 == 0xda) {
          iVar19 = stbi__get16be(psVar28->s);
          bVar12 = stbi__get8(psVar28->s);
          uVar53 = (uint)bVar12;
          psVar28->scan_n = (uint)bVar12;
          if (((byte)(bVar12 - 5) < 0xfc) ||
             (psVar30 = psVar28->s, psVar30->img_n < (int)(uint)bVar12)) {
            stbi__g_failure_reason = "bad SOS component count";
          }
          else if (iVar19 == (uint)bVar12 * 2 + 6) {
            lVar29 = 0;
            while( true ) {
              bVar12 = stbi__get8(psVar30);
              if ((int)uVar53 <= lVar29) break;
              bVar13 = stbi__get8(psVar28->s);
              psVar30 = psVar28->s;
              uVar53 = psVar30->img_n;
              uVar38 = 0;
              if (0 < (int)uVar53) {
                uVar38 = (ulong)uVar53;
              }
              paVar50 = paVar1;
              for (uVar60 = 0; uVar38 != uVar60; uVar60 = uVar60 + 1) {
                if (paVar50->id == (uint)bVar12) {
                  uVar38 = uVar60 & 0xffffffff;
                  break;
                }
                paVar50 = paVar50 + 1;
              }
              if ((uint)uVar38 == uVar53) goto LAB_001af956;
              psVar28->img_comp[uVar38].hd = (uint)(bVar13 >> 4);
              if (0x3f < bVar13) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_001af956;
              }
              paVar1[uVar38].ha = bVar13 & 0xf;
              if (3 < (bVar13 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_001af956;
              }
              psVar28->order[lVar29] = (uint)uVar38;
              lVar29 = lVar29 + 1;
              uVar53 = psVar28->scan_n;
            }
            psVar28->spec_start = (uint)bVar12;
            bVar12 = stbi__get8(psVar28->s);
            psVar28->spec_end = (uint)bVar12;
            bVar12 = stbi__get8(psVar28->s);
            psVar28->succ_high = (uint)(bVar12 >> 4);
            psVar28->succ_low = bVar12 & 0xf;
            iVar19 = psVar28->spec_start;
            if (psVar28->progressive == 0) {
              if (((iVar19 == 0) && (bVar12 < 0x10)) && ((bVar12 & 0xf) == 0)) {
                psVar28->spec_end = 0x3f;
                goto LAB_001ae41d;
              }
            }
            else if (((iVar19 < 0x40) && (psVar28->spec_end < 0x40)) &&
                    ((iVar19 <= psVar28->spec_end && ((bVar12 < 0xe0 && ((bVar12 & 0xf) < 0xe))))))
            {
LAB_001ae41d:
              stbi__jpeg_reset(psVar28);
              if (psVar28->progressive == 0) {
                if (psVar28->scan_n == 1) {
                  iVar19 = psVar28->order[0];
                  uVar53 = psVar28->img_comp[iVar19].x + 7 >> 3;
                  iVar27 = psVar28->img_comp[iVar19].y + 7 >> 3;
                  if ((int)uVar53 < 1) {
                    uVar53 = 0;
                  }
                  iVar52 = 0;
                  if (iVar27 < 1) {
                    iVar27 = 0;
                  }
                  for (iVar46 = 0; iVar46 != iVar27; iVar46 = iVar46 + 1) {
                    for (lVar29 = 0; (ulong)uVar53 * 8 != lVar29; lVar29 = lVar29 + 8) {
                      iVar47 = stbi__jpeg_decode_block
                                         (psVar28,data,
                                          (stbi__huffman *)psVar28->huff_dc[paVar1[iVar19].hd].fast,
                                          (stbi__huffman *)psVar28->huff_ac[paVar1[iVar19].ha].fast,
                                          psVar28->fast_ac[paVar1[iVar19].ha],iVar19,
                                          psVar28->dequant[paVar1[iVar19].tq]);
                      if (iVar47 == 0) {
                        bVar62 = false;
                        goto LAB_001aecaf;
                      }
                      (*psVar28->idct_block_kernel)
                                (paVar1[iVar19].data + lVar29 + iVar52 * paVar1[iVar19].w2,
                                 paVar1[iVar19].w2,data);
                      iVar47 = psVar28->todo;
                      psVar28->todo = iVar47 + -1;
                      if (iVar47 < 2) {
                        if (psVar28->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar28);
                        }
                        if ((psVar28->marker & 0xf8) != 0xd0) goto LAB_001aecac;
                        stbi__jpeg_reset(psVar28);
                      }
                    }
                    iVar52 = iVar52 + 8;
                  }
                }
                else {
                  for (iVar19 = 0; iVar19 < psVar28->img_mcu_y; iVar19 = iVar19 + 1) {
                    for (iVar27 = 0; iVar27 < psVar28->img_mcu_x; iVar27 = iVar27 + 1) {
                      for (lVar29 = 0; lVar29 < psVar28->scan_n; lVar29 = lVar29 + 1) {
                        iVar52 = psVar28->order[lVar29];
                        for (iVar46 = 0; iVar46 < paVar1[iVar52].v; iVar46 = iVar46 + 1) {
                          for (iVar47 = 0; iVar21 = paVar1[iVar52].h, iVar47 < iVar21;
                              iVar47 = iVar47 + 1) {
                            iVar22 = paVar1[iVar52].v;
                            iVar23 = stbi__jpeg_decode_block
                                               (psVar28,data,
                                                (stbi__huffman *)
                                                psVar28->huff_dc[paVar1[iVar52].hd].fast,
                                                (stbi__huffman *)
                                                psVar28->huff_ac[paVar1[iVar52].ha].fast,
                                                psVar28->fast_ac[paVar1[iVar52].ha],iVar52,
                                                psVar28->dequant[paVar1[iVar52].tq]);
                            if (iVar23 == 0) {
                              bVar62 = false;
                              goto LAB_001aecaf;
                            }
                            (*psVar28->idct_block_kernel)
                                      (paVar1[iVar52].data +
                                       (long)((iVar21 * iVar27 + iVar47) * 8) +
                                       (long)((iVar22 * iVar19 + iVar46) * paVar1[iVar52].w2 * 8),
                                       paVar1[iVar52].w2,data);
                          }
                        }
                      }
                      iVar52 = psVar28->todo;
                      psVar28->todo = iVar52 + -1;
                      if (iVar52 < 2) {
                        if (psVar28->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar28);
                        }
                        if ((psVar28->marker & 0xf8) != 0xd0) goto LAB_001aecac;
                        stbi__jpeg_reset(psVar28);
                      }
                    }
                  }
                }
LAB_001aecac:
                bVar62 = true;
LAB_001aecaf:
                if (!bVar62) goto LAB_001af956;
              }
              else if (psVar28->scan_n == 1) {
                iVar19 = psVar28->order[0];
                iVar27 = psVar28->img_comp[iVar19].x + 7 >> 3;
                iVar52 = psVar28->img_comp[iVar19].y + 7 >> 3;
                iVar46 = 0;
                if (iVar27 < 1) {
                  iVar27 = iVar46;
                }
                if (iVar52 < 1) {
                  iVar52 = iVar46;
                }
                for (; iVar46 != iVar52; iVar46 = iVar46 + 1) {
                  for (iVar47 = 0; iVar47 != iVar27; iVar47 = iVar47 + 1) {
                    psVar42 = paVar1[iVar19].coeff +
                              (paVar1[iVar19].coeff_w * iVar46 + iVar47) * 0x40;
                    uVar38 = (ulong)psVar28->spec_start;
                    if (uVar38 == 0) {
                      iVar21 = stbi__jpeg_decode_block_prog_dc
                                         (psVar28,psVar42,
                                          (stbi__huffman *)psVar28->huff_dc[paVar1[iVar19].hd].fast,
                                          iVar19);
                      if (iVar21 == 0) goto LAB_001af956;
                    }
                    else {
                      iVar21 = paVar1[iVar19].ha;
                      psVar37 = psVar28->huff_ac[iVar21].fast;
                      iVar22 = psVar28->eob_run;
                      bVar12 = (byte)psVar28->succ_low;
                      if (psVar28->succ_high == 0) {
                        if (iVar22 == 0) {
                          do {
                            if (psVar28->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(psVar28);
                            }
                            sVar41 = psVar28->fast_ac[iVar21][psVar28->code_buffer >> 0x17];
                            uVar53 = (uint)sVar41;
                            iVar22 = (int)uVar38;
                            if (sVar41 == 0) {
                              uVar53 = stbi__jpeg_huff_decode(psVar28,(stbi__huffman *)psVar37);
                              if ((int)uVar53 < 0) goto LAB_001af2bc;
                              uVar43 = uVar53 >> 4;
                              if ((uVar53 & 0xf) == 0) {
                                if (uVar53 < 0xf0) {
                                  iVar22 = 1 << ((byte)uVar43 & 0x1f);
                                  psVar28->eob_run = iVar22;
                                  if (0xf < uVar53) {
                                    iVar22 = stbi__jpeg_get_bits(psVar28,uVar43);
                                    iVar22 = iVar22 + psVar28->eob_run;
                                  }
                                  goto LAB_001ae5c4;
                                }
                                uVar38 = (ulong)(iVar22 + 0x10);
                              }
                              else {
                                lVar29 = (ulong)uVar43 + (long)iVar22;
                                uVar38 = (ulong)((int)lVar29 + 1);
                                bVar13 = ""[lVar29];
                                iVar22 = stbi__extend_receive(psVar28,uVar53 & 0xf);
                                psVar42[bVar13] = (short)(iVar22 << (bVar12 & 0x1f));
                              }
                            }
                            else {
                              lVar29 = (ulong)(uVar53 >> 4 & 0xf) + (long)iVar22;
                              psVar28->code_buffer = psVar28->code_buffer << (sbyte)(uVar53 & 0xf);
                              psVar28->code_bits = psVar28->code_bits - (uVar53 & 0xf);
                              uVar38 = (ulong)((int)lVar29 + 1);
                              psVar42[""[lVar29]] = (short)((uVar53 >> 8) << (bVar12 & 0x1f));
                            }
                          } while ((int)uVar38 <= psVar28->spec_end);
                        }
                        else {
LAB_001ae5c4:
                          psVar28->eob_run = iVar22 + -1;
                        }
                      }
                      else if (iVar22 == 0) {
                        iVar21 = 0x10000 << (bVar12 & 0x1f);
                        do {
                          uVar53 = stbi__jpeg_huff_decode(psVar28,(stbi__huffman *)psVar37);
                          if ((int)uVar53 < 0) goto LAB_001af2bc;
                          uVar43 = uVar53 >> 4;
                          if ((uVar53 & 0xf) == 1) {
                            iVar22 = stbi__jpeg_get_bit(psVar28);
                            iVar23 = 1;
                            if (iVar22 == 0) {
                              iVar23 = 0xffff;
                            }
                            sVar41 = (short)(iVar23 << (bVar12 & 0x1f));
                          }
                          else {
                            if ((uVar53 & 0xf) != 0) {
                              stbi__g_failure_reason = "bad huffman code";
                              goto LAB_001af956;
                            }
                            if (uVar53 < 0xf0) {
                              psVar28->eob_run = ~(-1 << ((byte)uVar43 & 0x1f));
                              if (0xf < uVar53) {
                                iVar22 = stbi__jpeg_get_bits(psVar28,uVar43);
                                psVar28->eob_run = psVar28->eob_run + iVar22;
                              }
                              uVar43 = 0x40;
                            }
                            else {
                              uVar43 = 0xf;
                            }
                            sVar41 = 0;
                          }
                          uVar60 = (long)(int)uVar38;
                          do {
                            while( true ) {
                              uVar38 = uVar60;
                              iVar22 = psVar28->spec_end;
                              if ((long)iVar22 < (long)uVar38) goto LAB_001ae6f4;
                              bVar13 = ""[uVar38];
                              if (psVar42[bVar13] == 0) break;
                              iVar22 = stbi__jpeg_get_bit(psVar28);
                              if ((iVar22 != 0) &&
                                 (sVar6 = psVar42[bVar13], (iVar21 >> 0x10 & (int)sVar6) == 0)) {
                                sVar10 = (short)((uint)iVar21 >> 0x10);
                                if (sVar6 < 1) {
                                  sVar10 = -sVar10;
                                }
                                psVar42[bVar13] = sVar6 + sVar10;
                              }
                              uVar60 = uVar38 + 1;
                            }
                            bVar62 = uVar43 != 0;
                            uVar43 = uVar43 - 1;
                            uVar60 = uVar38 + 1;
                          } while (bVar62);
                          psVar42[bVar13] = sVar41;
                          uVar38 = uVar38 + 1;
LAB_001ae6f4:
                        } while ((int)uVar38 <= iVar22);
                      }
                      else {
                        psVar28->eob_run = iVar22 + -1;
                        uVar53 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                        for (; (long)uVar38 <= (long)psVar28->spec_end; uVar38 = uVar38 + 1) {
                          bVar12 = ""[uVar38];
                          if (((psVar42[bVar12] != 0) &&
                              (iVar21 = stbi__jpeg_get_bit(psVar28), iVar21 != 0)) &&
                             (sVar41 = psVar42[bVar12], (uVar53 & (int)sVar41) == 0)) {
                            uVar43 = -uVar53;
                            if (0 < sVar41) {
                              uVar43 = uVar53;
                            }
                            psVar42[bVar12] = (short)uVar43 + sVar41;
                          }
                        }
                      }
                    }
                    iVar21 = psVar28->todo;
                    psVar28->todo = iVar21 + -1;
                    if (iVar21 < 2) {
                      if (psVar28->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar28);
                      }
                      bVar12 = psVar28->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_001aecbe;
                      stbi__jpeg_reset(psVar28);
                    }
                  }
                }
              }
              else {
                for (iVar19 = 0; iVar19 < psVar28->img_mcu_y; iVar19 = iVar19 + 1) {
                  for (iVar27 = 0; iVar27 < psVar28->img_mcu_x; iVar27 = iVar27 + 1) {
                    for (lVar29 = 0; lVar29 < psVar28->scan_n; lVar29 = lVar29 + 1) {
                      iVar52 = psVar28->order[lVar29];
                      for (iVar46 = 0; iVar46 < paVar1[iVar52].v; iVar46 = iVar46 + 1) {
                        iVar47 = 0;
                        while (iVar47 < paVar1[iVar52].h) {
                          iVar21 = stbi__jpeg_decode_block_prog_dc
                                             (psVar28,paVar1[iVar52].coeff +
                                                      (paVar1[iVar52].h * iVar27 + iVar47 +
                                                      (paVar1[iVar52].v * iVar19 + iVar46) *
                                                      paVar1[iVar52].coeff_w) * 0x40,
                                              (stbi__huffman *)
                                              psVar28->huff_dc[paVar1[iVar52].hd].fast,iVar52);
                          iVar47 = iVar47 + 1;
                          if (iVar21 == 0) goto LAB_001af956;
                        }
                      }
                    }
                    iVar52 = psVar28->todo;
                    psVar28->todo = iVar52 + -1;
                    if (iVar52 < 2) {
                      if (psVar28->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar28);
                      }
                      bVar12 = psVar28->marker;
                      if ((bVar12 & 0xf8) != 0xd0) goto LAB_001aecbe;
                      stbi__jpeg_reset(psVar28);
                    }
                  }
                }
              }
              bVar12 = psVar28->marker;
LAB_001aecbe:
              if (bVar12 == 0xff) {
                do {
                  iVar19 = stbi__at_eof(psVar28->s);
                  if (iVar19 != 0) goto LAB_001ae27f;
                  sVar14 = stbi__get8(psVar28->s);
                } while (sVar14 != 0xff);
                sVar14 = stbi__get8(psVar28->s);
                psVar28->marker = sVar14;
              }
              goto LAB_001ae27f;
            }
            stbi__g_failure_reason = "bad SOS";
          }
          else {
            stbi__g_failure_reason = "bad SOS len";
          }
          goto LAB_001af956;
        }
        if (bVar12 == 0xdc) {
          iVar19 = stbi__get16be(psVar28->s);
          sVar20 = stbi__get16be(psVar28->s);
          if (iVar19 == 4) {
            if (sVar20 == psVar28->s->img_y) goto LAB_001ae27f;
            stbi__g_failure_reason = "bad DNL height";
          }
          else {
            stbi__g_failure_reason = "bad DNL len";
          }
          goto LAB_001af956;
        }
        if (bVar12 != 0xd9) {
          iVar19 = stbi__process_marker(psVar28,(uint)bVar12);
          if (iVar19 != 0) goto LAB_001ae27f;
          goto LAB_001af956;
        }
        if (psVar28->progressive == 0) {
          psVar30 = psVar28->s;
          uVar53 = psVar30->img_n;
        }
        else {
          lVar29 = 0;
          while( true ) {
            psVar30 = psVar28->s;
            uVar53 = psVar30->img_n;
            if ((int)uVar53 <= lVar29) break;
            uVar53 = psVar28->img_comp[lVar29].x + 7 >> 3;
            iVar19 = psVar28->img_comp[lVar29].y + 7 >> 3;
            uVar60 = 0;
            uVar38 = (ulong)uVar53;
            if ((int)uVar53 < 1) {
              uVar38 = uVar60;
            }
            if (iVar19 < 1) {
              iVar19 = 0;
            }
            while (iVar27 = (int)uVar60, iVar27 != iVar19) {
              for (uVar60 = 0; uVar60 != uVar38; uVar60 = uVar60 + 1) {
                psVar42 = paVar1[lVar29].coeff;
                iVar46 = paVar1[lVar29].coeff_w * iVar27;
                iVar52 = paVar1[lVar29].tq;
                iVar47 = iVar46 + (int)uVar60;
                for (lVar48 = 0; lVar48 != 0x40; lVar48 = lVar48 + 1) {
                  psVar42[iVar47 * 0x40 + lVar48] =
                       psVar42[iVar47 * 0x40 + lVar48] * psVar28->dequant[iVar52][lVar48];
                }
                (*psVar28->idct_block_kernel)
                          (paVar1[lVar29].data + uVar60 * 8 + (long)(iVar27 * 8 * paVar1[lVar29].w2)
                           ,paVar1[lVar29].w2,psVar42 + (iVar46 + (int)uVar60) * 0x40);
              }
              uVar60 = (ulong)(iVar27 + 1);
            }
            lVar29 = lVar29 + 1;
          }
        }
        uVar43 = (2 < (int)uVar53) + 1 + (uint)(2 < (int)uVar53);
        if (req_comp != 0) {
          uVar43 = req_comp;
        }
        lVar29 = 0;
        bVar62 = false;
        if ((uVar53 == 3) && (bVar62 = true, psVar28->rgb != 3)) {
          if (psVar28->app14_color_transform == 0) {
            bVar62 = psVar28->jfif == 0;
          }
          else {
            bVar62 = false;
          }
        }
        uVar38 = 0;
        if (0 < (int)uVar53) {
          uVar38 = (ulong)uVar53;
        }
        uVar60 = 1;
        if (bVar62) {
          uVar60 = uVar38;
        }
        if (2 < (int)uVar43) {
          uVar60 = uVar38;
        }
        if (uVar53 != 3) {
          uVar60 = uVar38;
        }
        do {
          if (uVar60 * 0x30 == lVar29) {
            sVar20 = psVar30->img_y;
            psVar35 = (stbi__context *)stbi__malloc_mad3(uVar43,psVar30->img_x,sVar20,1);
            if (psVar35 != (stbi__context *)0x0) {
              iVar19 = 0;
              uVar53 = 0;
              do {
                if (sVar20 <= uVar53) {
                  stbi__cleanup_jpeg(psVar28);
                  psVar30 = psVar28->s;
                  *x = psVar30->img_x;
                  *y = psVar30->img_y;
                  if (comp != (int *)0x0) {
                    *comp = (uint)(2 < psVar30->img_n) * 2 + 1;
                  }
                  goto LAB_001af965;
                }
                sVar20 = psVar30->img_x;
                ppsVar58 = coutput;
                for (lVar29 = 0; uVar60 * 0x30 != lVar29; lVar29 = lVar29 + 0x30) {
                  puVar36 = (undefined8 *)((long)data + lVar29 + 0x10);
                  iVar27 = *(int *)((long)data + lVar29 + 0x24);
                  iVar52 = *(int *)((long)data + lVar29 + 0x1c);
                  iVar46 = iVar52 >> 1;
                  puVar2 = (undefined8 *)((long)data + lVar29 + 8);
                  puVar39 = puVar36;
                  if (iVar27 < iVar46) {
                    puVar39 = puVar2;
                  }
                  if (iVar46 <= iVar27) {
                    puVar36 = puVar2;
                  }
                  psVar37 = (stbi_uc *)
                            (**(code **)((long)data + lVar29))
                                      (*(undefined8 *)
                                        ((long)&psVar28->img_comp[0].linebuf + lVar29 * 2),*puVar39,
                                       *puVar36,*(undefined4 *)((long)data + lVar29 + 0x20));
                  *ppsVar58 = psVar37;
                  *(int *)((long)data + lVar29 + 0x24) = iVar27 + 1;
                  if (iVar52 <= iVar27 + 1) {
                    *(undefined4 *)((long)data + lVar29 + 0x24) = 0;
                    lVar48 = *(long *)((long)data + lVar29 + 0x10);
                    *(long *)((long)data + lVar29 + 8) = lVar48;
                    iVar27 = *(int *)((long)data + lVar29 + 0x28) + 1;
                    *(int *)((long)data + lVar29 + 0x28) = iVar27;
                    if (iVar27 < *(int *)((long)&psVar28->img_comp[0].y + lVar29 * 2)) {
                      *(long *)((long)data + lVar29 + 0x10) =
                           lVar48 + *(int *)((long)&psVar28->img_comp[0].w2 + lVar29 * 2);
                    }
                  }
                  ppsVar58 = ppsVar58 + 1;
                }
                if ((int)uVar43 < 3) {
                  psVar30 = psVar28->s;
                  if (bVar62) {
                    uVar38 = (ulong)(sVar20 * iVar19);
                    if (uVar43 == 1) {
                      for (uVar49 = 0; uVar49 < psVar30->img_x; uVar49 = uVar49 + 1) {
                        psVar35->buffer_start[uVar49 + uVar38 + -0x38] =
                             (stbi_uc)((uint)*(byte *)(CONCAT44(coutput[2]._4_4_,(uint)coutput[2]) +
                                                      uVar49) * 0x1d +
                                       (uint)*(byte *)(CONCAT44(coutput[1]._4_4_,(int)coutput[1]) +
                                                      uVar49) * 0x96 +
                                       (uint)*(byte *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) +
                                                      uVar49) * 0x4d >> 8);
                      }
                    }
                    else {
                      for (uVar49 = 0; uVar49 < psVar30->img_x; uVar49 = uVar49 + 1) {
                        psVar35->buffer_start[uVar49 * 2 + uVar38 + -0x38] =
                             (stbi_uc)((uint)*(byte *)(CONCAT44(coutput[2]._4_4_,(uint)coutput[2]) +
                                                      uVar49) * 0x1d +
                                       (uint)*(byte *)(CONCAT44(coutput[1]._4_4_,(int)coutput[1]) +
                                                      uVar49) * 0x96 +
                                       (uint)*(byte *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) +
                                                      uVar49) * 0x4d >> 8);
                        psVar35->buffer_start[uVar49 * 2 + uVar38 + -0x37] = 0xff;
                      }
                    }
                  }
                  else if (psVar30->img_n == 4) {
                    if (psVar28->app14_color_transform == 2) {
                      psVar37 = psVar35->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                      for (uVar38 = 0; uVar38 < psVar30->img_x; uVar38 = uVar38 + 1) {
                        iVar27 = (*(byte *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) + uVar38) ^
                                 0xff) * (uint)*(byte *)(CONCAT44(coutput[3]._4_4_,(uint)coutput[3])
                                                        + uVar38);
                        psVar37[-1] = (char)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        *psVar37 = 0xff;
                        psVar37 = psVar37 + uVar43;
                      }
                    }
                    else {
                      if (psVar28->app14_color_transform != 0) goto LAB_001b04ed;
                      psVar37 = psVar35->buffer_start + ((ulong)(sVar20 * iVar19) - 0x37);
                      for (uVar38 = 0; uVar38 < psVar30->img_x; uVar38 = uVar38 + 1) {
                        bVar12 = *(byte *)(CONCAT44(coutput[3]._4_4_,(uint)coutput[3]) + uVar38);
                        iVar52 = (uint)*(byte *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) + uVar38
                                                ) * (uint)bVar12;
                        iVar46 = (uint)*(byte *)(CONCAT44(coutput[1]._4_4_,(int)coutput[1]) + uVar38
                                                ) * (uint)bVar12;
                        iVar27 = (uint)*(byte *)(CONCAT44(coutput[2]._4_4_,(uint)coutput[2]) +
                                                uVar38) * (uint)bVar12;
                        psVar37[-1] = (char)(((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8) * 0x1d +
                                             (iVar46 + (iVar46 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                             (iVar52 + (iVar52 + 0x80U >> 8) + 0x80 >> 8) * 0x4d >>
                                            8);
                        *psVar37 = 0xff;
                        psVar37 = psVar37 + uVar43;
                      }
                    }
                  }
                  else {
LAB_001b04ed:
                    uVar38 = (ulong)(sVar20 * iVar19);
                    if (uVar43 == 1) {
                      for (uVar49 = 0; uVar49 < psVar30->img_x; uVar49 = uVar49 + 1) {
                        psVar35->buffer_start[uVar49 + uVar38 + -0x38] =
                             *(stbi_uc *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) + uVar49);
                      }
                    }
                    else {
                      for (uVar49 = 0; uVar49 < psVar30->img_x; uVar49 = uVar49 + 1) {
                        psVar35->buffer_start[uVar49 * 2 + uVar38 + -0x38] =
                             *(stbi_uc *)(CONCAT44(coutput[0]._4_4_,(int)coutput[0]) + uVar49);
                        psVar35->buffer_start[uVar49 * 2 + uVar38 + -0x37] = 0xff;
                      }
                    }
                  }
                }
                else {
                  psVar37 = (stbi_uc *)CONCAT44(coutput[0]._4_4_,(int)coutput[0]);
                  psVar30 = psVar28->s;
                  if (psVar30->img_n == 3) {
                    if (bVar62) {
                      psVar45 = psVar35->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                      for (uVar38 = 0; uVar38 < psVar30->img_x; uVar38 = uVar38 + 1) {
                        psVar45[-3] = psVar37[uVar38];
                        psVar45[-2] = *(undefined1 *)
                                       (CONCAT44(coutput[1]._4_4_,(int)coutput[1]) + uVar38);
                        psVar45[-1] = *(undefined1 *)
                                       (CONCAT44(coutput[2]._4_4_,(uint)coutput[2]) + uVar38);
                        *psVar45 = 0xff;
                        psVar45 = psVar45 + uVar43;
                      }
                    }
                    else {
LAB_001b0523:
                      (*psVar28->YCbCr_to_RGB_kernel)
                                (psVar35->buffer_start + ((ulong)(uVar53 * uVar43 * sVar20) - 0x38),
                                 psVar37,(stbi_uc *)CONCAT44(coutput[1]._4_4_,(int)coutput[1]),
                                 (stbi_uc *)CONCAT44(coutput[2]._4_4_,(uint)coutput[2]),
                                 psVar30->img_x,uVar43);
                    }
                  }
                  else if (psVar30->img_n == 4) {
                    if (psVar28->app14_color_transform == 2) {
                      (*psVar28->YCbCr_to_RGB_kernel)
                                (psVar35->buffer_start + ((ulong)(uVar53 * uVar43 * sVar20) - 0x38),
                                 psVar37,(stbi_uc *)CONCAT44(coutput[1]._4_4_,(int)coutput[1]),
                                 (stbi_uc *)CONCAT44(coutput[2]._4_4_,(uint)coutput[2]),
                                 psVar30->img_x,uVar43);
                      psVar30 = psVar28->s;
                      psVar37 = psVar35->buffer_start + ((ulong)(sVar20 * iVar19) - 0x36);
                      for (uVar38 = 0; uVar38 < psVar30->img_x; uVar38 = uVar38 + 1) {
                        bVar12 = *(byte *)(CONCAT44(coutput[3]._4_4_,(uint)coutput[3]) + uVar38);
                        iVar27 = (psVar37[-2] ^ 0xff) * (uint)bVar12;
                        psVar37[-2] = (byte)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        iVar27 = (psVar37[-1] ^ 0xff) * (uint)bVar12;
                        psVar37[-1] = (byte)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        iVar27 = (*psVar37 ^ 0xff) * (uint)bVar12;
                        *psVar37 = (byte)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        psVar37 = psVar37 + uVar43;
                      }
                    }
                    else {
                      if (psVar28->app14_color_transform != 0) goto LAB_001b0523;
                      psVar45 = psVar35->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                      for (uVar38 = 0; uVar38 < psVar30->img_x; uVar38 = uVar38 + 1) {
                        bVar12 = *(byte *)(CONCAT44(coutput[3]._4_4_,(uint)coutput[3]) + uVar38);
                        iVar27 = (uint)psVar37[uVar38] * (uint)bVar12;
                        psVar45[-3] = (char)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        iVar27 = (uint)((stbi_uc *)CONCAT44(coutput[1]._4_4_,(int)coutput[1]))
                                       [uVar38] * (uint)bVar12;
                        psVar45[-2] = (char)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        iVar27 = (uint)((stbi_uc *)CONCAT44(coutput[2]._4_4_,(uint)coutput[2]))
                                       [uVar38] * (uint)bVar12;
                        psVar45[-1] = (char)((iVar27 + 0x80U >> 8) + iVar27 + 0x80 >> 8);
                        *psVar45 = 0xff;
                        psVar45 = psVar45 + uVar43;
                      }
                    }
                  }
                  else {
                    psVar45 = psVar35->buffer_start + ((ulong)(sVar20 * iVar19) - 0x35);
                    for (uVar38 = 0; uVar38 < psVar30->img_x; uVar38 = uVar38 + 1) {
                      sVar14 = psVar37[uVar38];
                      psVar45[-1] = sVar14;
                      psVar45[-2] = sVar14;
                      psVar45[-3] = sVar14;
                      *psVar45 = 0xff;
                      psVar45 = psVar45 + uVar43;
                    }
                  }
                }
                uVar53 = uVar53 + 1;
                psVar30 = psVar28->s;
                sVar20 = psVar30->img_y;
                iVar19 = iVar19 + uVar43;
              } while( true );
            }
            stbi__cleanup_jpeg(psVar28);
LAB_001b06ce:
            stbi__g_failure_reason = "outofmem";
            goto LAB_001af963;
          }
          sVar20 = psVar30->img_x;
          pvVar33 = malloc((ulong)(sVar20 + 3));
          *(void **)((long)&psVar28->img_comp[0].linebuf + lVar29 * 2) = pvVar33;
          if (pvVar33 == (void *)0x0) {
            stbi__cleanup_jpeg(psVar28);
            goto LAB_001b06ce;
          }
          uVar38 = (long)psVar28->img_h_max /
                   (long)*(int *)((long)&psVar28->img_comp[0].h + lVar29 * 2);
          iVar19 = (int)uVar38;
          *(int *)((long)data + lVar29 + 0x18) = iVar19;
          iVar27 = psVar28->img_v_max / *(int *)((long)&psVar28->img_comp[0].v + lVar29 * 2);
          *(int *)((long)data + lVar29 + 0x1c) = iVar27;
          *(int *)((long)data + lVar29 + 0x24) = iVar27 >> 1;
          *(int *)((long)data + lVar29 + 0x20) =
               (int)((ulong)((sVar20 + iVar19) - 1) / (uVar38 & 0xffffffff));
          *(undefined4 *)((long)data + lVar29 + 0x28) = 0;
          uVar8 = *(undefined8 *)((long)&psVar28->img_comp[0].data + lVar29 * 2);
          *(undefined8 *)((long)data + lVar29 + 0x10) = uVar8;
          *(undefined8 *)((long)data + lVar29 + 8) = uVar8;
          if (iVar19 == 2) {
            pcVar34 = stbi__resample_row_h_2;
            if (iVar27 != 1) {
              if (iVar27 != 2) goto LAB_001b0064;
              pcVar34 = psVar28->resample_row_hv_2_kernel;
            }
          }
          else if (iVar19 == 1) {
            pcVar34 = stbi__resample_row_generic;
            if (iVar27 == 2) {
              pcVar34 = stbi__resample_row_v_2;
            }
            if (iVar27 == 1) {
              pcVar34 = resample_row_1;
            }
          }
          else {
LAB_001b0064:
            pcVar34 = stbi__resample_row_generic;
          }
          *(code **)((long)data + lVar29) = pcVar34;
          lVar29 = lVar29 + 0x30;
        } while( true );
      }
LAB_001af956:
      stbi__cleanup_jpeg(psVar28);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_001af963:
    psVar35 = (stbi__context *)0x0;
    goto LAB_001af965;
  }
  iVar19 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar19 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    data._0_8_ = s;
    iVar19 = stbi__parse_png_file((stbi__png *)data,0,req_comp);
    uVar8 = data._0_8_;
    if (iVar19 == 0) {
      psVar35 = (stbi__context *)0x0;
    }
    else {
      iVar19 = 8;
      if (8 < (int)data._32_4_) {
        iVar19 = data._32_4_;
      }
      ri->bits_per_channel = iVar19;
      if ((req_comp != 0) && (iVar19 = *(int *)(data._0_8_ + 0xc), iVar19 != req_comp)) {
        if ((int)data._32_4_ < 9) {
          data._24_8_ = stbi__convert_format
                                  ((uchar *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_,
                                   *(uint *)(data._0_8_ + 4));
        }
        else {
          data._24_8_ = stbi__convert_format16
                                  ((stbi__uint16 *)data._24_8_,iVar19,req_comp,*(uint *)data._0_8_,
                                   *(uint *)(data._0_8_ + 4));
        }
        *(int *)(uVar8 + 0xc) = req_comp;
        if ((stbi__context *)data._24_8_ == (stbi__context *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(int *)uVar8;
      *y = *(int *)(uVar8 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar8 + 8);
      }
      psVar35 = (stbi__context *)data._24_8_;
      data._24_8_ = (void *)0x0;
    }
    free((void *)data._24_8_);
    free((void *)data._16_8_);
    psVar28 = (stbi__jpeg *)data._8_8_;
    goto LAB_001af965;
  }
  sVar14 = stbi__get8(s);
  if ((sVar14 == 'B') && (sVar14 = stbi__get8(s), sVar14 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar20 = stbi__get32le(s);
    if (((sVar20 < 0x39) && ((0x100010000001000U >> ((ulong)sVar20 & 0x3f) & 1) != 0)) ||
       ((sVar20 == 0x7c || (sVar20 == 0x6c)))) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      coutput[3]._4_4_ = 0xff;
      pvVar33 = stbi__bmp_parse_header(s,(stbi__bmp_data *)coutput);
      if (pvVar33 == (void *)0x0) {
        return (void *)0x0;
      }
      sVar20 = s->img_y;
      sVar24 = -sVar20;
      if (0 < (int)sVar20) {
        sVar24 = sVar20;
      }
      s->img_y = sVar24;
      local_8948 = coutput[3]._4_4_;
      if ((int)coutput[1] == 0xc) {
        if ((int)coutput[0] < 0x18) {
          uVar53 = (coutput[0]._4_4_ + -0x26) / 3;
        }
        else {
LAB_001af0e8:
          uVar53 = 0;
        }
      }
      else {
        if (0xf < (int)coutput[0]) goto LAB_001af0e8;
        uVar53 = (coutput[0]._4_4_ - (int)coutput[1]) + -0xe >> 2;
      }
      iVar19 = 4 - (uint)((uint)coutput[3] == 0);
      s->img_n = iVar19;
      if (2 < req_comp) {
        iVar19 = req_comp;
      }
      sVar25 = s->img_x;
      iVar27 = stbi__mad3sizes_valid(iVar19,sVar25,sVar24,0);
      if (iVar27 == 0) goto LAB_001b0fc9;
      puVar31 = (uchar *)stbi__malloc_mad3(iVar19,sVar25,sVar24,0);
      if (puVar31 == (uchar *)0x0) goto LAB_001afbc8;
      if ((int)coutput[0] < 0x10) {
        if (0x100 < (int)uVar53 || uVar53 == 0) {
          free(puVar31);
          stbi__g_failure_reason = "invalid";
          return (void *)0x0;
        }
        uVar60 = 0;
        uVar38 = 0;
        if (0 < (int)uVar53) {
          uVar38 = (ulong)uVar53;
        }
        for (; uVar38 != uVar60; uVar60 = uVar60 + 1) {
          sVar14 = stbi__get8(s);
          *(stbi_uc *)(data + uVar60 * 2 + 1) = sVar14;
          sVar14 = stbi__get8(s);
          *(stbi_uc *)((long)data + uVar60 * 4 + 1) = sVar14;
          sVar14 = stbi__get8(s);
          *(stbi_uc *)(data + uVar60 * 2) = sVar14;
          if ((int)coutput[1] != 0xc) {
            stbi__get8(s);
          }
          *(undefined1 *)((long)data + uVar60 * 4 + 3) = 0xff;
        }
        stbi__skip(s,(uVar53 * ((int)coutput[1] == 0xc | 0xfffffffc) - (int)coutput[1]) +
                     coutput[0]._4_4_ + -0xe);
        if ((int)coutput[0] == 1) {
          sVar25 = s->img_x;
          iVar27 = 0;
          uVar38 = 0;
LAB_001b0832:
          sVar24 = s->img_y;
          if (iVar27 < (int)sVar24) {
            iVar52 = 0;
            do {
              bVar12 = stbi__get8(s);
              sVar24 = s->img_x;
              iVar46 = 8;
              do {
                if ((int)sVar24 <= iVar52) {
LAB_001b08cf:
                  uVar38 = uVar38 & 0xffffffff;
                  stbi__skip(s,-(sVar25 + 7 >> 3) & 3);
                  iVar27 = iVar27 + 1;
                  goto LAB_001b0832;
                }
                uVar60 = (ulong)((bVar12 >> (iVar46 - 1U & 0x1f) & 1) != 0);
                iVar47 = (int)uVar38;
                lVar29 = (long)iVar47;
                uVar38 = lVar29 + 3;
                puVar31[lVar29] = (uchar)data[uVar60 * 2];
                puVar31[lVar29 + 1] = *(uchar *)((long)data + uVar60 * 4 + 1);
                puVar31[lVar29 + 2] = (uchar)data[uVar60 * 2 + 1];
                if (iVar19 == 4) {
                  puVar31[lVar29 + 3] = 0xff;
                  uVar38 = (ulong)(iVar47 + 4);
                }
                if (sVar24 - 1 == iVar52) goto LAB_001b08cf;
                iVar52 = iVar52 + 1;
                iVar47 = iVar46 + -1;
                bVar62 = 0 < iVar46;
                iVar46 = iVar47;
              } while (iVar47 != 0 && bVar62);
            } while( true );
          }
        }
        else {
          if ((int)coutput[0] == 8) {
            uVar53 = s->img_x;
          }
          else {
            if ((int)coutput[0] != 4) {
              free(puVar31);
              stbi__g_failure_reason = "bad bpp";
              return (void *)0x0;
            }
            uVar53 = s->img_x + 1 >> 1;
          }
          uVar38 = 0;
          for (iVar27 = 0; sVar24 = s->img_y, iVar27 < (int)sVar24; iVar27 = iVar27 + 1) {
            for (iVar52 = 0; iVar52 < (int)s->img_x; iVar52 = iVar52 + 2) {
              bVar12 = stbi__get8(s);
              uVar43 = (uint)(bVar12 >> 4);
              if ((int)coutput[0] != 4) {
                uVar43 = (uint)bVar12;
              }
              uVar60 = (ulong)uVar43;
              uVar43 = bVar12 & 0xf;
              if ((int)coutput[0] != 4) {
                uVar43 = 0;
              }
              lVar29 = (long)(int)uVar38;
              uVar49 = lVar29 + 3;
              puVar31[lVar29] = (uchar)data[uVar60 * 2];
              puVar31[lVar29 + 1] = *(uchar *)((long)data + uVar60 * 4 + 1);
              puVar31[lVar29 + 2] = (uchar)data[uVar60 * 2 + 1];
              if (iVar19 == 4) {
                puVar31[lVar29 + 3] = 0xff;
                uVar49 = (ulong)((int)uVar38 + 4);
              }
              if (iVar52 + 1U == s->img_x) {
                uVar38 = uVar49 & 0xffffffff;
                break;
              }
              if ((int)coutput[0] == 8) {
                bVar12 = stbi__get8(s);
                uVar43 = (uint)bVar12;
              }
              lVar29 = (long)(int)uVar49;
              uVar38 = lVar29 + 3;
              uVar60 = (ulong)uVar43;
              puVar31[lVar29] = (uchar)data[uVar60 * 2];
              puVar31[lVar29 + 1] = *(uchar *)((long)data + uVar60 * 4 + 1);
              puVar31[lVar29 + 2] = (uchar)data[uVar60 * 2 + 1];
              if (iVar19 == 4) {
                puVar31[lVar29 + 3] = 0xff;
                uVar38 = (ulong)((int)uVar49 + 4);
              }
            }
            stbi__skip(s,-uVar53 & 3);
          }
        }
        goto LAB_001b08ea;
      }
      stbi__skip(s,(coutput[0]._4_4_ - (int)coutput[1]) + -0xe);
      if ((int)coutput[0] == 0x10) {
        local_88ec = s->img_x * 2 & 2;
LAB_001afc88:
        if (coutput[2]._4_4_ == 0 || ((uint)coutput[2] == 0 || coutput[1]._4_4_ == 0)) {
          free(puVar31);
          stbi__g_failure_reason = "bad masks";
          return (void *)0x0;
        }
        iVar27 = stbi__high_bit(coutput[1]._4_4_);
        iVar27 = iVar27 + -7;
        iVar52 = stbi__bitcount(coutput[1]._4_4_);
        iVar46 = stbi__high_bit((uint)coutput[2]);
        iVar46 = iVar46 + -7;
        iVar47 = stbi__bitcount((uint)coutput[2]);
        iVar21 = stbi__high_bit(coutput[2]._4_4_);
        iVar21 = iVar21 + -7;
        local_88b0 = stbi__bitcount(coutput[2]._4_4_);
        local_88b4 = stbi__high_bit((uint)coutput[3]);
        local_88b4 = local_88b4 + -7;
        local_88b8 = stbi__bitcount((uint)coutput[3]);
        bVar11 = true;
        bVar62 = false;
      }
      else {
        if ((int)coutput[0] == 0x20) {
          local_88ec = 0;
          if ((uint)coutput[3] != 0xff000000 ||
              (coutput[1]._4_4_ != 0xff0000 ||
              ((uint)coutput[2] != 0xff00 || coutput[2]._4_4_ != 0xff))) goto LAB_001afc88;
          bVar62 = true;
        }
        else {
          local_88ec = 0;
          if ((int)coutput[0] != 0x18) goto LAB_001afc88;
          local_88ec = s->img_x & 3;
          bVar62 = false;
        }
        bVar11 = false;
        iVar27 = 0;
        iVar46 = 0;
        iVar21 = 0;
        local_88b4 = 0;
        iVar52 = 0;
        iVar47 = 0;
        local_88b0 = 0;
        local_88b8 = 0;
      }
      uVar38 = 0;
      for (iVar22 = 0; sVar24 = s->img_y, iVar22 < (int)sVar24; iVar22 = iVar22 + 1) {
        if (bVar11) {
          for (iVar23 = 0; iVar23 < (int)s->img_x; iVar23 = iVar23 + 1) {
            if ((int)coutput[0] == 0x10) {
              uVar53 = stbi__get16le(s);
            }
            else {
              uVar53 = stbi__get32le(s);
            }
            iVar26 = stbi__shiftsigned(uVar53 & coutput[1]._4_4_,iVar27,iVar52);
            lVar29 = (long)(int)uVar38;
            puVar31[lVar29] = (uchar)iVar26;
            iVar26 = stbi__shiftsigned(uVar53 & (uint)coutput[2],iVar46,iVar47);
            puVar31[lVar29 + 1] = (uchar)iVar26;
            iVar26 = stbi__shiftsigned(uVar53 & coutput[2]._4_4_,iVar21,local_88b0);
            puVar31[lVar29 + 2] = (uchar)iVar26;
            if ((uint)coutput[3] == 0) {
              uVar53 = 0xff;
            }
            else {
              uVar53 = stbi__shiftsigned(uVar53 & (uint)coutput[3],local_88b4,local_88b8);
            }
            uVar60 = lVar29 + 3;
            if (iVar19 == 4) {
              puVar31[lVar29 + 3] = (uchar)uVar53;
              uVar60 = (ulong)((int)uVar38 + 4);
            }
            local_8948 = local_8948 | uVar53;
            uVar38 = uVar60 & 0xffffffff;
          }
        }
        else {
          for (iVar23 = 0; iVar23 < (int)s->img_x; iVar23 = iVar23 + 1) {
            sVar14 = stbi__get8(s);
            lVar29 = (long)(int)uVar38;
            puVar31[lVar29 + 2] = sVar14;
            sVar14 = stbi__get8(s);
            puVar31[lVar29 + 1] = sVar14;
            sVar14 = stbi__get8(s);
            puVar31[lVar29] = sVar14;
            bVar12 = 0xff;
            if (bVar62) {
              bVar12 = stbi__get8(s);
            }
            uVar60 = lVar29 + 3;
            if (iVar19 == 4) {
              puVar31[lVar29 + 3] = bVar12;
              uVar60 = (ulong)((int)uVar38 + 4);
            }
            local_8948 = local_8948 | bVar12;
            uVar38 = uVar60 & 0xffffffff;
          }
        }
        stbi__skip(s,local_88ec);
      }
LAB_001b08ea:
      if ((iVar19 == 4) && (local_8948 == 0)) {
        for (uVar53 = s->img_x * sVar24 * 4 - 1; -1 < (int)uVar53; uVar53 = uVar53 - 4) {
          puVar31[uVar53] = 0xff;
        }
      }
      if (0 < (int)sVar20) {
        iVar27 = (int)sVar24 >> 1;
        if ((int)sVar24 >> 1 < 1) {
          iVar27 = 0;
        }
        iVar52 = (sVar24 - 1) * iVar19;
        iVar47 = 0;
        for (iVar46 = 0; iVar46 != iVar27; iVar46 = iVar46 + 1) {
          sVar20 = s->img_x;
          uVar38 = (ulong)(sVar20 * iVar19);
          if ((int)(sVar20 * iVar19) < 1) {
            uVar38 = 0;
          }
          for (uVar60 = 0; uVar38 != uVar60; uVar60 = uVar60 + 1) {
            uVar4 = puVar31[uVar60 + sVar20 * iVar47];
            puVar31[uVar60 + sVar20 * iVar47] = puVar31[uVar60 + sVar20 * iVar52];
            puVar31[uVar60 + sVar20 * iVar52] = uVar4;
          }
          iVar52 = iVar52 - iVar19;
          iVar47 = iVar47 + iVar19;
        }
      }
      uVar53 = s->img_x;
      if ((req_comp != 0) && (iVar19 != req_comp)) {
        puVar31 = stbi__convert_format(puVar31,iVar19,req_comp,uVar53,sVar24);
        if (puVar31 == (uchar *)0x0) {
          return (void *)0x0;
        }
        uVar53 = s->img_x;
      }
      *x = uVar53;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
        return puVar31;
      }
      return puVar31;
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar19 = stbi__gif_test(s);
  if (iVar19 != 0) {
    memset((stbi__gif *)data,0,0x8870);
    psVar30 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)data,comp,0,psVar37);
    psVar35 = (stbi__context *)0x0;
    if (psVar30 != (stbi__context *)0x0 && psVar30 != s) {
      *x = data._0_4_;
      *y = data._4_4_;
      psVar35 = psVar30;
      if ((req_comp & 0xfffffffbU) != 0) {
        psVar35 = (stbi__context *)
                  stbi__convert_format((uchar *)psVar30,4,req_comp,data._0_4_,data._4_4_);
      }
    }
    free((void *)data._24_8_);
    psVar28 = (stbi__jpeg *)data._16_8_;
    goto LAB_001af965;
  }
  sVar20 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar20 == 0x38425053) {
    sVar20 = stbi__get32be(s);
    if (sVar20 != 0x38425053) {
      stbi__g_failure_reason = "not PSD";
      return (void *)0x0;
    }
    iVar19 = stbi__get16be(s);
    if (iVar19 != 1) {
      stbi__g_failure_reason = "wrong version";
      return (void *)0x0;
    }
    stbi__skip(s,6);
    uVar53 = stbi__get16be(s);
    if (0x10 < uVar53) {
      stbi__g_failure_reason = "wrong channel count";
      return (void *)0x0;
    }
    sVar20 = stbi__get32be(s);
    sVar24 = stbi__get32be(s);
    iVar19 = stbi__get16be(s);
    if ((iVar19 != 8) && (iVar19 != 0x10)) {
      stbi__g_failure_reason = "unsupported bit depth";
      return (void *)0x0;
    }
    iVar27 = stbi__get16be(s);
    if (iVar27 != 3) {
      stbi__g_failure_reason = "wrong color format";
      return (void *)0x0;
    }
    sVar25 = stbi__get32be(s);
    stbi__skip(s,sVar25);
    sVar25 = stbi__get32be(s);
    stbi__skip(s,sVar25);
    sVar25 = stbi__get32be(s);
    stbi__skip(s,sVar25);
    uVar43 = stbi__get16be(s);
    if (1 < uVar43) {
      stbi__g_failure_reason = "bad compression";
      return (void *)0x0;
    }
    iVar27 = stbi__mad3sizes_valid(4,sVar24,sVar20,0);
    if (iVar27 == 0) goto LAB_001b0fc9;
    if (((bpc == 0x10) && (iVar19 == 0x10)) && (uVar43 == 0)) {
      data_00 = (stbi__uint16 *)stbi__malloc_mad3(8,sVar24,sVar20,0);
      ri->bits_per_channel = 0x10;
    }
    else {
      data_00 = (stbi__uint16 *)malloc((long)(int)(sVar20 * sVar24 * 4));
    }
    if (data_00 != (stbi__uint16 *)0x0) {
      uVar59 = sVar24 * sVar20;
      if (uVar43 == 0) {
        uVar38 = 0;
        psVar61 = data_00;
        local_8978 = data_00;
        uVar43 = 0;
        if (0 < (int)uVar59) {
          uVar43 = uVar59;
        }
        for (; uVar38 != 4; uVar38 = uVar38 + 1) {
          if (uVar38 < uVar53) {
            if (ri->bits_per_channel == 0x10) {
              for (lVar29 = 0; uVar43 != (uint)lVar29; lVar29 = lVar29 + 1) {
                iVar27 = stbi__get16be(s);
                local_8978[lVar29 * 4] = (stbi__uint16)iVar27;
              }
            }
            else {
              lVar29 = 0;
              if (iVar19 == 0x10) {
                for (; uVar43 != (uint)lVar29; lVar29 = lVar29 + 1) {
                  iVar27 = stbi__get16be(s);
                  *(char *)(psVar61 + lVar29 * 2) = (char)((uint)iVar27 >> 8);
                }
              }
              else {
                for (; uVar43 != (uint)lVar29; lVar29 = lVar29 + 1) {
                  sVar14 = stbi__get8(s);
                  *(stbi_uc *)(psVar61 + lVar29 * 2) = sVar14;
                }
              }
            }
          }
          else if (iVar19 == 0x10 && bpc == 0x10) {
            for (lVar29 = 0; uVar43 != (uint)lVar29; lVar29 = lVar29 + 1) {
              local_8978[lVar29 * 4] = -(ushort)(uVar38 == 3);
            }
          }
          else {
            for (lVar29 = 0; uVar43 != (uint)lVar29; lVar29 = lVar29 + 1) {
              *(char *)(psVar61 + lVar29 * 2) = -(uVar38 == 3);
            }
          }
          psVar61 = (stbi__uint16 *)((long)psVar61 + 1);
          local_8978 = local_8978 + 1;
        }
      }
      else {
        stbi__skip(s,sVar20 * uVar53 * 2);
        uVar38 = 0;
        psVar61 = data_00;
        uVar43 = 0;
        if (0 < (int)uVar59) {
          uVar43 = uVar59;
        }
        for (; uVar38 != 4; uVar38 = uVar38 + 1) {
          if (uVar38 < uVar53) {
            psVar37 = (stbi_uc *)((long)data_00 + uVar38);
            iVar19 = 0;
            do {
              uVar57 = uVar59 - iVar19;
              do {
                if ((int)uVar57 < 1) goto LAB_001b0b88;
                bVar12 = stbi__get8(s);
              } while (bVar12 == 0x80);
              uVar54 = (uint)bVar12;
              if ((char)bVar12 < '\0') {
                uVar55 = 0x101 - uVar54;
                if (uVar57 < uVar55) goto LAB_001b10fa;
                sVar14 = stbi__get8(s);
                for (iVar27 = uVar54 - 0x101; iVar27 != 0; iVar27 = iVar27 + 1) {
                  *psVar37 = sVar14;
                  psVar37 = psVar37 + 4;
                }
              }
              else {
                if (uVar57 <= bVar12) {
LAB_001b10fa:
                  free(data_00);
                  stbi__g_failure_reason = "corrupt";
                  return (void *)0x0;
                }
                uVar55 = uVar54 + 1;
                uVar57 = uVar55;
                while (bVar62 = uVar57 != 0, uVar57 = uVar57 - 1, bVar62) {
                  sVar14 = stbi__get8(s);
                  *psVar37 = sVar14;
                  psVar37 = psVar37 + 4;
                }
              }
              iVar19 = iVar19 + uVar55;
            } while( true );
          }
          for (lVar29 = 0; uVar43 != (uint)lVar29; lVar29 = lVar29 + 1) {
            *(char *)(psVar61 + lVar29 * 2) = -(uVar38 == 3);
          }
LAB_001b0b88:
          psVar61 = (stbi__uint16 *)((long)psVar61 + 1);
        }
      }
      if (3 < uVar53) {
        uVar38 = 0;
        if (0 < (int)uVar59) {
          uVar38 = (ulong)uVar59;
        }
        if (ri->bits_per_channel == 0x10) {
          for (uVar60 = 0; uVar38 != uVar60; uVar60 = uVar60 + 1) {
            uVar7 = data_00[uVar60 * 4 + 3];
            if ((uVar7 != 0) && (uVar7 != 0xffff)) {
              fVar64 = 1.0 / ((float)uVar7 / 65535.0);
              fVar63 = (1.0 - fVar64) * 65535.0;
              auVar65._0_4_ =
                   (int)(fVar63 + fVar64 * (float)(*(uint *)(data_00 + uVar60 * 4) & 0xffff));
              auVar65._4_4_ =
                   (int)(fVar63 + fVar64 * (float)(*(uint *)(data_00 + uVar60 * 4) >> 0x10));
              auVar65._8_4_ = (int)(fVar63 + fVar64 * 0.0);
              auVar65._12_4_ = (int)(fVar63 + fVar64 * 0.0);
              auVar65 = pshuflw(auVar65,auVar65,0xe8);
              *(int *)(data_00 + uVar60 * 4) = auVar65._0_4_;
              data_00[uVar60 * 4 + 2] =
                   (stbi__uint16)(int)((float)data_00[uVar60 * 4 + 2] * fVar64 + fVar63);
            }
          }
        }
        else {
          for (uVar60 = 0; uVar38 != uVar60; uVar60 = uVar60 + 1) {
            bVar12 = *(byte *)((long)data_00 + uVar60 * 4 + 3);
            if ((bVar12 != 0) && (bVar12 != 0xff)) {
              fVar64 = 1.0 / ((float)bVar12 / 255.0);
              fVar63 = (1.0 - fVar64) * 255.0;
              *(char *)(data_00 + uVar60 * 2) =
                   (char)(int)((float)(byte)data_00[uVar60 * 2] * fVar64 + fVar63);
              *(char *)((long)data_00 + uVar60 * 4 + 1) =
                   (char)(int)((float)*(byte *)((long)data_00 + uVar60 * 4 + 1) * fVar64 + fVar63);
              *(char *)(data_00 + uVar60 * 2 + 1) =
                   (char)(int)((float)(byte)data_00[uVar60 * 2 + 1] * fVar64 + fVar63);
            }
          }
        }
      }
      if ((req_comp & 0xfffffffbU) != 0) {
        if (ri->bits_per_channel == 0x10) {
          data_00 = stbi__convert_format16(data_00,4,req_comp,sVar24,sVar20);
        }
        else {
          data_00 = (stbi__uint16 *)stbi__convert_format((uchar *)data_00,4,req_comp,sVar24,sVar20);
        }
        if (data_00 == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      if (comp != (int *)0x0) {
        *comp = 4;
      }
      *y = sVar20;
      *x = sVar24;
      return data_00;
    }
    goto LAB_001afbc8;
  }
  iVar19 = stbi__pic_is4(s,anon_var_dwarf_34fe1f);
  if (iVar19 == 0) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
  }
  else {
    iVar19 = 0x54;
    while (bVar62 = iVar19 != 0, iVar19 = iVar19 + -1, bVar62) {
      stbi__get8(s);
    }
    iVar19 = stbi__pic_is4(s,"PICT");
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar19 != 0) {
      iVar19 = 0x5c;
      while (bVar62 = iVar19 != 0, iVar19 = iVar19 + -1, bVar62) {
        stbi__get8(s);
      }
      uVar53 = stbi__get16be(s);
      uVar43 = stbi__get16be(s);
      iVar19 = stbi__at_eof(s);
      if (iVar19 != 0) {
        stbi__g_failure_reason = "bad file";
        return (void *)0x0;
      }
      bVar12 = 0;
      iVar19 = stbi__mad3sizes_valid(uVar53,uVar43,4,0);
      if (iVar19 == 0) goto LAB_001b0fc9;
      stbi__get32be(s);
      stbi__get16be(s);
      stbi__get16be(s);
      psVar28 = (stbi__jpeg *)stbi__malloc_mad3(uVar53,uVar43,4,0);
      memset(psVar28,0xff,(ulong)(uVar53 * 4 * uVar43));
      pbVar56 = (byte *)(data + 1);
      lVar29 = 0;
      do {
        if (lVar29 == 10) {
LAB_001afbb4:
          stbi__g_failure_reason = "bad format";
          goto LAB_001b0c90;
        }
        sVar14 = stbi__get8(s);
        bVar13 = stbi__get8(s);
        pbVar56[-2] = bVar13;
        bVar16 = stbi__get8(s);
        pbVar56[-1] = bVar16;
        bVar16 = stbi__get8(s);
        *pbVar56 = bVar16;
        iVar19 = stbi__at_eof(s);
        if (iVar19 != 0) {
          stbi__g_failure_reason = "bad file";
          goto LAB_001b0c90;
        }
        if (bVar13 != 8) goto LAB_001afbb4;
        bVar12 = bVar12 | bVar16;
        pbVar56 = pbVar56 + 3;
        lVar29 = lVar29 + 1;
      } while (sVar14 != '\0');
      uVar59 = 4 - ((bVar12 & 0x10) == 0);
      if (comp != (int *)0x0) {
        *comp = uVar59;
      }
      for (uVar38 = 0; uVar38 != uVar43; uVar38 = uVar38 + 1) {
        psVar37 = psVar28->huff_dc[0].fast + (long)(int)(uVar53 * 4 * (int)uVar38) + -8;
        for (lVar48 = 0; lVar29 != lVar48; lVar48 = lVar48 + 1) {
          lVar9 = lVar48 * 3;
          cVar3 = *(char *)((long)data + lVar9 + 1);
          psVar45 = psVar37;
          uVar57 = uVar53;
          if (cVar3 != '\0') {
            if (cVar3 == '\x01') {
              for (; 0 < (int)uVar57; uVar57 = uVar57 - (uVar54 & 0xff)) {
                bVar12 = stbi__get8(s);
                iVar19 = stbi__at_eof(s);
                if (iVar19 != 0) goto LAB_001b0c6f;
                psVar32 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),(stbi_uc *)coutput
                                       );
                if (psVar32 == (stbi_uc *)0x0) goto LAB_001b0c7d;
                uVar54 = (uint)bVar12;
                if (uVar57 < bVar12) {
                  uVar54 = uVar57;
                }
                uVar55 = uVar54 & 0xff;
                while (bVar62 = uVar55 != 0, uVar55 = uVar55 - 1, bVar62) {
                  stbi__copyval((uint)*(byte *)((long)data + lVar9 + 2),psVar45,(stbi_uc *)coutput);
                  psVar45 = psVar45 + 4;
                }
              }
              goto LAB_001af918;
            }
            if (cVar3 == '\x02') {
              for (; 0 < (int)uVar57; uVar57 = uVar57 - iVar19) {
                bVar12 = stbi__get8(s);
                iVar19 = stbi__at_eof(s);
                if (iVar19 != 0) goto LAB_001b0c6f;
                uVar54 = (uint)bVar12;
                if ((char)bVar12 < '\0') {
                  if (uVar54 == 0x80) {
                    iVar19 = stbi__get16be(s);
                  }
                  else {
                    iVar19 = uVar54 - 0x7f;
                  }
                  if ((int)uVar57 < iVar19) goto LAB_001b0c6f;
                  psVar32 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),
                                          (stbi_uc *)coutput);
                  iVar27 = iVar19;
                  if (psVar32 == (stbi_uc *)0x0) goto LAB_001b0c7d;
                  while (iVar27 != 0) {
                    stbi__copyval((uint)*(byte *)((long)data + lVar9 + 2),psVar45,(stbi_uc *)coutput
                                 );
                    psVar45 = psVar45 + 4;
                    iVar27 = iVar27 + -1;
                  }
                }
                else {
                  iVar19 = bVar12 + 1;
                  iVar27 = iVar19;
                  if (uVar57 <= uVar54) goto LAB_001b0c6f;
                  while (bVar62 = iVar27 != 0, iVar27 = iVar27 + -1, bVar62) {
                    psVar32 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),psVar45);
                    if (psVar32 == (stbi_uc *)0x0) goto LAB_001b0c7d;
                    psVar45 = psVar45 + 4;
                  }
                }
              }
              goto LAB_001af918;
            }
            stbi__g_failure_reason = "bad format";
            goto LAB_001b0c7d;
          }
          while (bVar62 = uVar57 != 0, uVar57 = uVar57 - 1, bVar62) {
            psVar32 = stbi__readval(s,(uint)*(byte *)((long)data + lVar9 + 2),psVar45);
            if (psVar32 == (stbi_uc *)0x0) goto LAB_001b0c7d;
            psVar45 = psVar45 + 4;
          }
LAB_001af918:
        }
      }
      s = (stbi__context *)(ulong)uVar59;
      if (psVar28 == (stbi__jpeg *)0x0) goto LAB_001b0c90;
      goto LAB_001b0c97;
    }
  }
  sVar14 = stbi__get8(s);
  sVar15 = stbi__get8(s);
  if ((sVar14 == 'P') && (0xfd < (byte)(sVar15 - 0x37))) {
    iVar19 = stbi__pnm_info(s,(int *)s,(int *)&s->img_y,&s->img_n);
    if (iVar19 == 0) {
      return (void *)0x0;
    }
    *x = s->img_x;
    sVar20 = s->img_y;
    *y = sVar20;
    iVar19 = s->img_n;
    if (comp != (int *)0x0) {
      *comp = iVar19;
      sVar20 = s->img_y;
    }
    sVar24 = s->img_x;
    iVar27 = stbi__mad3sizes_valid(iVar19,sVar24,sVar20,0);
    if (iVar27 == 0) goto LAB_001b0fc9;
    puVar31 = (uchar *)stbi__malloc_mad3(iVar19,sVar24,sVar20,0);
    if (puVar31 != (uchar *)0x0) {
      stbi__getn(s,puVar31,sVar20 * iVar19 * sVar24);
      if (req_comp == 0) {
        return puVar31;
      }
      iVar19 = s->img_n;
      if (iVar19 != req_comp) {
        puVar31 = stbi__convert_format(puVar31,iVar19,req_comp,s->img_x,s->img_y);
        return puVar31;
      }
      return puVar31;
    }
    goto LAB_001afbc8;
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar19 = stbi__hdr_test(s);
  if (iVar19 != 0) {
    psVar28 = (stbi__jpeg *)stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
    if (req_comp == 0) {
      req_comp = *comp;
    }
    if (psVar28 == (stbi__jpeg *)0x0) {
      return (void *)0x0;
    }
    iVar19 = *x;
    iVar27 = *y;
    psVar35 = (stbi__context *)stbi__malloc_mad3(iVar19,iVar27,req_comp,0);
    if (psVar35 != (stbi__context *)0x0) {
      uVar43 = (req_comp + (req_comp & 1U)) - 1;
      uVar53 = iVar27 * iVar19;
      uVar38 = (ulong)uVar43;
      if ((int)uVar43 < 1) {
        uVar38 = 0;
      }
      lVar29 = (long)req_comp;
      uVar60 = (ulong)uVar53;
      if ((int)uVar53 < 1) {
        uVar60 = 0;
      }
      psVar30 = psVar35;
      psVar51 = psVar28;
      for (uVar49 = 0; uVar49 != uVar60; uVar49 = uVar49 + 1) {
        for (uVar44 = 0; uVar38 != uVar44; uVar44 = uVar44 + 1) {
          fVar63 = powf(*(float *)(psVar51->huff_dc[0].fast + uVar44 * 4 + -8) * stbi__h2l_scale_i,
                        stbi__h2l_gamma_i);
          fVar64 = fVar63 * 255.0 + 0.5;
          fVar63 = 0.0;
          if (0.0 <= fVar64) {
            fVar63 = fVar64;
          }
          fVar64 = 255.0;
          if (fVar63 <= 255.0) {
            fVar64 = fVar63;
          }
          psVar30->buffer_start[uVar44 - 0x38] = (stbi_uc)(int)fVar64;
        }
        if ((int)uVar38 < req_comp) {
          lVar48 = uVar49 * lVar29 + uVar38;
          fVar64 = *(float *)(psVar28->huff_dc[0].fast + lVar48 * 4 + -8) * 255.0 + 0.5;
          fVar63 = 0.0;
          if (0.0 <= fVar64) {
            fVar63 = fVar64;
          }
          fVar64 = 255.0;
          if (fVar63 <= 255.0) {
            fVar64 = fVar63;
          }
          psVar35->buffer_start[lVar48 + -0x38] = (stbi_uc)(int)fVar64;
        }
        psVar30 = (stbi__context *)(psVar30->buffer_start + lVar29 + -0x38);
        psVar51 = (stbi__jpeg *)(psVar51->huff_dc[0].fast + lVar29 * 4 + -8);
      }
LAB_001af965:
      free(psVar28);
      return psVar35;
    }
LAB_001afbc3:
    free(psVar28);
LAB_001afbc8:
    stbi__g_failure_reason = "outofmem";
    return (void *)0x0;
  }
  stbi__get8(s);
  bVar12 = stbi__get8(s);
  if (bVar12 < 2) {
    bVar13 = stbi__get8(s);
    if (bVar12 == 1) {
      if ((bVar13 & 0xf7) == 1) {
        iVar19 = 4;
        stbi__skip(s,4);
        bVar13 = stbi__get8(s);
        if ((bVar13 < 0x21) && ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) != 0))
        goto LAB_001afee5;
      }
    }
    else if ((bVar13 & 0xf6) == 2) {
      iVar19 = 9;
LAB_001afee5:
      stbi__skip(s,iVar19);
      iVar19 = stbi__get16le(s);
      if ((iVar19 != 0) && (iVar19 = stbi__get16le(s), iVar19 != 0)) {
        bVar13 = stbi__get8(s);
        if (bVar12 == 1) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if ((bVar13 - 8 & 0xf7) != 0) goto LAB_001afa3d;
        }
        else {
          if ((0x20 < bVar13) || ((0x101018100U >> ((ulong)bVar13 & 0x3f) & 1) == 0))
          goto LAB_001afa2d;
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
        }
        bVar13 = stbi__get8(s);
        sVar14 = stbi__get8(s);
        bVar16 = stbi__get8(s);
        iVar19 = stbi__get16le(s);
        uVar57 = stbi__get16le(s);
        bVar12 = stbi__get8(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar53 = stbi__get16le(s);
        uVar43 = stbi__get16le(s);
        bVar17 = stbi__get8(s);
        data._0_8_ = (ulong)(uint)data._4_4_ << 0x20;
        bVar18 = stbi__get8(s);
        coutput[0]._0_4_ = 0;
        if (sVar14 == '\0') {
          uVar59 = bVar16 - 8;
          if (bVar16 < 8) {
            uVar59 = (uint)bVar16;
          }
          uVar59 = (uint)(uVar59 == 3);
          bVar12 = bVar17;
        }
        else {
          uVar59 = 0;
        }
        uVar59 = stbi__tga_get_comp((uint)bVar12,uVar59,(int *)data);
        if (uVar59 == 0) {
          stbi__g_failure_reason = "bad format";
          return (void *)0x0;
        }
        *x = uVar53;
        *y = uVar43;
        if (comp != (int *)0x0) {
          *comp = uVar59;
        }
        iVar27 = stbi__mad3sizes_valid(uVar53,uVar43,uVar59,0);
        if (iVar27 == 0) {
LAB_001b0fc9:
          stbi__g_failure_reason = "too large";
          return (void *)0x0;
        }
        psVar28 = (stbi__jpeg *)stbi__malloc_mad3(uVar53,uVar43,uVar59,0);
        if (psVar28 == (stbi__jpeg *)0x0) goto LAB_001afbc8;
        stbi__skip(s,(uint)bVar13);
        uVar38 = (ulong)uVar59;
        if (((sVar14 == '\0') && (bVar16 < 8)) && (data._0_4_ == 0)) {
          uVar54 = 0;
          uVar57 = uVar43;
          while (uVar57 = uVar57 - 1, uVar57 != 0xffffffff) {
            uVar55 = uVar54;
            if ((bVar18 >> 5 & 1) == 0) {
              uVar55 = uVar57;
            }
            stbi__getn(s,psVar28->huff_dc[0].fast + (long)(int)(uVar55 * uVar59 * uVar53) + -8,
                       uVar59 * uVar53);
            uVar54 = uVar54 + 1;
          }
        }
        else {
          if (sVar14 == '\0') {
            local_8958 = (stbi_uc *)0x0;
          }
          else {
            stbi__skip(s,iVar19);
            local_8958 = (stbi_uc *)stbi__malloc_mad2(uVar57,uVar59,0);
            if (local_8958 == (stbi_uc *)0x0) goto LAB_001afbc3;
            if (data._0_4_ == 0) {
              iVar19 = stbi__getn(s,local_8958,uVar59 * uVar57);
              if (iVar19 == 0) {
                free(psVar28);
                free(local_8958);
                stbi__g_failure_reason = "bad palette";
                return (void *)0x0;
              }
            }
            else {
              if (uVar59 != 3) {
                __assert_fail("tga_comp == STBI_rgb",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/stb/include/stb_image.h"
                              ,0x15dd,
                              "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                             );
              }
              for (lVar29 = 0; uVar57 * 3 != (int)lVar29; lVar29 = lVar29 + 3) {
                stbi__tga_read_rgb16(s,local_8958 + lVar29);
              }
            }
          }
          bVar62 = true;
          iVar19 = 0;
          uVar54 = 0;
          psVar51 = psVar28;
          for (uVar60 = 0; uVar60 != uVar43 * uVar53; uVar60 = uVar60 + 1) {
            if (bVar16 < 8) {
LAB_001b1230:
              if (sVar14 == '\0') {
                if (data._0_4_ == 0) {
                  for (uVar49 = 0; uVar38 != uVar49; uVar49 = uVar49 + 1) {
                    sVar15 = stbi__get8(s);
                    *(stbi_uc *)((long)coutput + uVar49) = sVar15;
                  }
                }
                else {
                  if (uVar59 != 3) {
                    __assert_fail("tga_comp == STBI_rgb",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/stb/include/stb_image.h"
                                  ,0x160e,
                                  "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                 );
                  }
                  stbi__tga_read_rgb16(s,(stbi_uc *)coutput);
                }
              }
              else {
                if (bVar17 == 8) {
                  bVar12 = stbi__get8(s);
                  uVar55 = (uint)bVar12;
                }
                else {
                  uVar55 = stbi__get16le(s);
                }
                if (uVar57 <= uVar55) {
                  uVar55 = 0;
                }
                for (uVar49 = 0; uVar38 != uVar49; uVar49 = uVar49 + 1) {
                  *(stbi_uc *)((long)coutput + uVar49) = local_8958[uVar49 + uVar55 * uVar59];
                }
              }
            }
            else {
              if (iVar19 == 0) {
                bVar12 = stbi__get8(s);
                iVar19 = (bVar12 & 0x7f) + 1;
                uVar54 = (uint)(bVar12 >> 7);
                goto LAB_001b1230;
              }
              if (uVar54 == 0 || bVar62) {
                uVar54 = (uint)(uVar54 != 0);
                goto LAB_001b1230;
              }
              uVar54 = 1;
            }
            for (uVar49 = 0; uVar38 != uVar49; uVar49 = uVar49 + 1) {
              psVar51->huff_dc[0].fast[uVar49 - 8] = *(stbi_uc *)((long)coutput + uVar49);
            }
            iVar19 = iVar19 + -1;
            psVar51 = (stbi__jpeg *)(psVar51->huff_dc[0].fast + (uVar38 - 8));
            bVar62 = false;
          }
          if ((bVar18 >> 5 & 1) == 0) {
            iVar19 = uVar59 * uVar53;
            iVar27 = (uVar43 - 1) * iVar19;
            uVar57 = 0;
            for (uVar54 = 0; uVar54 != uVar43 + 1 >> 1; uVar54 = uVar54 + 1) {
              psVar51 = psVar28;
              for (iVar52 = iVar19; 0 < iVar52; iVar52 = iVar52 + -1) {
                sVar14 = psVar51->huff_dc[0].fast[(ulong)uVar57 - 8];
                psVar51->huff_dc[0].fast[(ulong)uVar57 - 8] =
                     psVar51->huff_dc[0].fast[(long)iVar27 + -8];
                psVar51->huff_dc[0].fast[(long)iVar27 + -8] = sVar14;
                psVar51 = (stbi__jpeg *)((long)&psVar51->s + 1);
              }
              uVar57 = uVar57 + iVar19;
              iVar27 = iVar27 - iVar19;
            }
          }
          free(local_8958);
        }
        if ((2 < uVar59) && (data._0_4_ == 0)) {
          iVar19 = uVar43 * uVar53;
          puVar40 = (undefined1 *)((long)&psVar28->s + 2);
          while (bVar62 = iVar19 != 0, iVar19 = iVar19 + -1, bVar62) {
            uVar5 = puVar40[-2];
            puVar40[-2] = *puVar40;
            *puVar40 = uVar5;
            puVar40 = puVar40 + uVar38;
          }
        }
        if (req_comp == 0) {
          return psVar28;
        }
        if (uVar59 == req_comp) {
          return psVar28;
        }
LAB_001b0cd7:
        puVar31 = stbi__convert_format((uchar *)psVar28,uVar59,req_comp,uVar53,uVar43);
        return puVar31;
      }
    }
  }
LAB_001afa2d:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
LAB_001afa3d:
  stbi__g_failure_reason = "unknown image type";
  return (void *)0x0;
LAB_001af2bc:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_001af956;
LAB_001ae27f:
  bVar12 = stbi__get_marker(psVar28);
  goto LAB_001ae21c;
LAB_001b0c6f:
  stbi__g_failure_reason = "bad file";
LAB_001b0c7d:
  s = (stbi__context *)(ulong)uVar59;
LAB_001b0c90:
  uVar59 = (uint)s;
  free(psVar28);
  psVar28 = (stbi__jpeg *)0x0;
LAB_001b0c97:
  *x = uVar53;
  *y = uVar43;
  bVar62 = req_comp != 0;
  if (bVar62) {
    uVar59 = req_comp;
  }
  req_comp = uVar59;
  if (!bVar62 && comp != (int *)0x0) {
    req_comp = *comp;
  }
  uVar59 = 4;
  goto LAB_001b0cd7;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}